

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitClassInitializers
               (ParseNode *memberList,RegSlot objectLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo,ParseNode *parentNode,bool isObjectEmpty)

{
  bool *in_RAX;
  ParseNodeBin *pPVar1;
  
  if (memberList != (ParseNode *)0x0) {
    while (memberList->nop == knopList) {
      pPVar1 = ParseNode::AsParseNodeBin(memberList);
      EmitMemberNode(pPVar1->pnode1,objectLocation,byteCodeGenerator,funcInfo,parentNode,false,
                     in_RAX);
      pPVar1 = ParseNode::AsParseNodeBin(memberList);
      memberList = pPVar1->pnode2;
    }
    EmitMemberNode(memberList,objectLocation,byteCodeGenerator,funcInfo,parentNode,false,in_RAX);
  }
  return;
}

Assistant:

void EmitClassInitializers(ParseNode *memberList, Js::RegSlot objectLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, ParseNode* parentNode, bool isObjectEmpty)
{
    if (memberList != nullptr)
    {
        while (memberList->nop == knopList)
        {
            ParseNode *memberNode = memberList->AsParseNodeBin()->pnode1;
            EmitMemberNode(memberNode, objectLocation, byteCodeGenerator, funcInfo, parentNode, /*useStore*/ false, &isObjectEmpty);
            memberList = memberList->AsParseNodeBin()->pnode2;
        }
        EmitMemberNode(memberList, objectLocation, byteCodeGenerator, funcInfo, parentNode, /*useStore*/ false, &isObjectEmpty);
    }
}